

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUPlugin.cpp
# Opt level: O1

void __thiscall beagle::cpu::BeagleCPUPlugin::BeagleCPUPlugin(BeagleCPUPlugin *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  plugin::Plugin::Plugin(&this->super_Plugin,"CPU","CPU");
  (this->super_Plugin)._vptr_Plugin = (_func_int **)&PTR_pluginName_abi_cxx11__0014c4d0;
  p_Var2 = (_List_node_base *)operator_new(0x30);
  p_Var2[1]._M_next = (_List_node_base *)"CPU (x86_64)";
  p_Var2[1]._M_prev = (_List_node_base *)0x141d30;
  p_Var2[2]._M_next = (_List_node_base *)0xffffffffca30d7f7;
  p_Var2[2]._M_prev = (_List_node_base *)0x8000000;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->super_Plugin).beagleResources.
            super__List_base<BeagleResource,_std::allocator<BeagleResource>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(8);
  p_Var2->_M_next = (_List_node_base *)&PTR_createImpl_0014c558;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->super_Plugin).beagleFactories.
            super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(8);
  p_Var2->_M_next = (_List_node_base *)&PTR_createImpl_0014d0b0;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->super_Plugin).beagleFactories.
            super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(8);
  p_Var2->_M_next = (_List_node_base *)&PTR_createImpl_0014daa8;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->super_Plugin).beagleFactories.
            super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(8);
  p_Var2->_M_next = (_List_node_base *)&PTR_createImpl_0014dae8;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->super_Plugin).beagleFactories.
            super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

BeagleCPUPlugin::BeagleCPUPlugin() :
Plugin("CPU", "CPU")
{
	BeagleResource resource;
#ifdef __aarch64__
	    resource.name = (char*) "CPU (arm64)";
#else
        resource.name = (char*) "CPU (x86_64)";
#endif
        resource.description = (char*) "";
        resource.supportFlags = BEAGLE_FLAG_COMPUTATION_SYNCH |
                                         BEAGLE_FLAG_SCALING_MANUAL | BEAGLE_FLAG_SCALING_ALWAYS | BEAGLE_FLAG_SCALING_AUTO | BEAGLE_FLAG_SCALING_DYNAMIC |
                                         BEAGLE_FLAG_THREADING_NONE | BEAGLE_FLAG_THREADING_CPP |
                                         BEAGLE_FLAG_PROCESSOR_CPU |
                                         BEAGLE_FLAG_PRECISION_SINGLE | BEAGLE_FLAG_PRECISION_DOUBLE |
                                         BEAGLE_FLAG_VECTOR_NONE |
                                         BEAGLE_FLAG_SCALERS_LOG | BEAGLE_FLAG_SCALERS_RAW |
                                         BEAGLE_FLAG_EIGEN_COMPLEX | BEAGLE_FLAG_EIGEN_REAL |
                                         BEAGLE_FLAG_INVEVEC_STANDARD | BEAGLE_FLAG_INVEVEC_TRANSPOSED |
                                         BEAGLE_FLAG_PREORDER_TRANSPOSE_MANUAL | BEAGLE_FLAG_PREORDER_TRANSPOSE_AUTO |
                                         BEAGLE_FLAG_FRAMEWORK_CPU;
        resource.requiredFlags = BEAGLE_FLAG_FRAMEWORK_CPU;
	beagleResources.push_back(resource);

	// Optional for plugins: check if the hardware is compatible and only populate
	// list with compatible factories
	beagleFactories.push_back(new beagle::cpu::BeagleCPU4StateImplFactory<double>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPU4StateImplFactory<float>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPUImplFactory<double>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPUImplFactory<float>());
}